

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O2

Slice __thiscall leveldb::InternalKey::user_key(InternalKey *this)

{
  long in_FS_OFFSET;
  Slice SVar1;
  Slice local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.data_ = (this->rep_)._M_dataplus._M_p;
  local_18.size_ = (this->rep_)._M_string_length;
  SVar1 = ExtractUserKey(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

Slice user_key() const { return ExtractUserKey(rep_); }